

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O1

void __thiscall
license::test::env_var_point_to_wrong_file::test_method(env_var_point_to_wrong_file *this)

{
  bool bVar1;
  ostream *poVar2;
  AuditEvent *pAVar3;
  long local_1c0;
  undefined1 local_1b8 [32];
  undefined **local_198;
  ulong local_190;
  shared_count sStack_188;
  LCC_EVENT_TYPE_conflict **local_180;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  LicenseReader licenseReader;
  LCC_EVENT_TYPE_conflict *local_150;
  long *local_148;
  undefined1 local_140 [8];
  undefined8 local_138;
  shared_count sStack_130;
  undefined4 local_124;
  undefined **local_120;
  char *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  EventRegistry registry;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  setenv("LICENSE_LOCATION",
         "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/this/file/doesnt/exist"
         ,1);
  locate::LocatorFactory::find_license_near_moduleb = 0;
  locate::LocatorFactory::find_license_with_env_varb = 1;
  LicenseReader::LicenseReader(&licenseReader,(LicenseLocation *)0x0);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"PRODUCT","");
  LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_1b8,&licenseInfos);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  poVar2 = license::operator<<((ostream *)std::cout,&registry);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x69);
  bVar1 = EventRegistry::isGood(&registry);
  local_198 = (undefined **)CONCAT71(local_198._1_7_,!bVar1);
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_1b8._24_8_ = &local_120;
  local_120 = (undefined **)0x1a216f;
  local_118 = "";
  local_1b8[8] = 0;
  local_1b8._0_8_ = &PTR__lazy_ostream_001cf1b8;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion(&local_198,local_1b8,&local_60,0x69,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_188);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x6a);
  local_1c0 = ((long)licenseInfos.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)licenseInfos.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5;
  local_140[0] = licenseInfos.
                 super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish ==
                 licenseInfos.
                 super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
  local_120 = &PTR__lazy_ostream_001cf230;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_148 = (long *)&local_124;
  local_124 = 0;
  local_150 = (LCC_EVENT_TYPE_conflict *)&local_1c0;
  local_138 = 0;
  sStack_130.pi_ = (sp_counted_base *)0x0;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_f8 = "";
  local_1b8[8] = 0;
  local_1b8._0_8_ = &PTR__lazy_ostream_001cf270;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_190 = local_190 & 0xffffffffffffff00;
  local_198 = &PTR__lazy_ostream_001cf2b0;
  sStack_188.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8._24_8_ = &local_148;
  local_180 = &local_150;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_130);
  pAVar3 = EventRegistry::getLastFailure(&registry);
  if (pAVar3 != (AuditEvent *)0x0) {
    local_90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_88 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x6c);
    local_118 = (char *)((ulong)local_118 & 0xffffffffffffff00);
    local_120 = &PTR__lazy_ostream_001cf230;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_108 = "";
    local_1c0 = CONCAT44(local_1c0._4_4_,1);
    pAVar3 = EventRegistry::getLastFailure(&registry);
    local_150 = &pAVar3->event_type;
    local_140[0] = (LCC_EVENT_TYPE_conflict)local_1c0 == pAVar3->event_type;
    local_138 = 0;
    sStack_130.pi_ = (sp_counted_base *)0x0;
    local_100 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_f8 = "";
    local_148 = &local_1c0;
    local_1b8[8] = 0;
    local_1b8._0_8_ = &PTR__lazy_ostream_001cf2f0;
    local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_190 = local_190 & 0xffffffffffffff00;
    local_198 = &PTR__lazy_ostream_001cf2f0;
    sStack_188.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1b8._24_8_ = &local_148;
    local_180 = &local_150;
    boost::test_tools::tt_detail::report_assertion
              (local_140,&local_120,&local_100,0x6c,1,2,2,"LICENSE_FILE_NOT_FOUND",local_1b8,
               "registry.getLastFailure()->event_type",&local_198);
    boost::detail::shared_count::~shared_count(&sStack_130);
    unsetenv("LICENSE_LOCATION");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~_Rb_tree(&registry.mostAdvancedLogIdx_by_LicenseId._M_t);
    if (registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer_conflict)0x0) {
      operator_delete(registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (&licenseInfos);
    LicenseReader::~LicenseReader(&licenseReader);
    return;
  }
  __assert_fail("registry.getLastFailure() != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
                ,0x6b,"void license::test::env_var_point_to_wrong_file::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(env_var_point_to_wrong_file) {
	const char *environment_variable_value = PROJECT_TEST_SRC_DIR "/this/file/doesnt/exist";
	SETENV(LCC_LICENSE_LOCATION_ENV_VAR, environment_variable_value)
	locate::LocatorFactory::find_license_near_module(false);
	locate::LocatorFactory::find_license_with_env_var(true);

	LicenseReader licenseReader(nullptr);
	vector<FullLicenseInfo> licenseInfos;
	const EventRegistry registry = licenseReader.readLicenses("PRODUCT", licenseInfos);
	cout << registry << endl;
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure() != NULL);
	BOOST_CHECK_EQUAL(LICENSE_FILE_NOT_FOUND, registry.getLastFailure()->event_type);
	UNSETENV(LCC_LICENSE_LOCATION_ENV_VAR);
}